

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall soul::heart::Printer::PrinterStream::printDescription(PrinterStream *this,Branch *b)

{
  size_t sVar1;
  CodePrinter *this_00;
  Block *b_00;
  string local_40;
  
  this_00 = choc::text::CodePrinter::operator<<(this->out,"branch ");
  getBlockName_abi_cxx11_(&local_40,(PrinterStream *)(b->target).object,b_00);
  choc::text::CodePrinter::operator<<(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  sVar1 = (b->targetArgs).numActive;
  if (sVar1 != 0) {
    local_40._M_dataplus._M_p = (pointer)(b->targetArgs).items;
    local_40._M_string_length = (long)local_40._M_dataplus._M_p + sVar1 * 8;
    printArgList(this,(ArrayView<soul::pool_ref<soul::heart::Expression>_> *)&local_40);
  }
  return;
}

Assistant:

void printDescription (const heart::Branch& b)
        {
            out << "branch " << getBlockName (b.target);

            if (! b.targetArgs.empty())
                printArgList (b.targetArgs);
        }